

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_engine * adios2_get_engine(adios2_io *io,char *name)

{
  adios2_engine *paVar1;
  allocator local_51;
  allocator local_50 [32];
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"for adios2_io, in call to adios2_open",local_50)
  ;
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)local_50,name,&local_51);
  paVar1 = (adios2_engine *)adios2::core::IO::GetEngine((string *)io);
  std::__cxx11::string::~string((string *)local_50);
  return paVar1;
}

Assistant:

adios2_engine *adios2_get_engine(adios2_io *io, const char *name)
{
    adios2_engine *engine = nullptr;
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_open");
        engine = reinterpret_cast<adios2_engine *>(
            &reinterpret_cast<adios2::core::IO *>(io)->GetEngine(name));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_open");
    }
    return engine;
}